

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O0

void __thiscall MinVR::VRHeadTrackingNode::onVREvent(VRHeadTrackingNode *this,VRDataIndex *e)

{
  VRAnyCoreType t;
  byte bVar1;
  VRAnyCoreType m2;
  VRMatrix4 *in_RDI;
  bool in_stack_00000157;
  string *in_stack_00000158;
  string *in_stack_00000160;
  VRDataIndex *in_stack_00000168;
  VRDataIndex *in_stack_fffffffffffffef8;
  VRMatrix4 *this_00;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  allocator<char> in_stack_ffffffffffffff27;
  string local_d8 [8];
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator<char> local_a1;
  string local_a0 [32];
  VRDatum_conflict *local_80;
  VRMatrix4 local_78;
  string local_30 [48];
  
  VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffffef8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff27,
                                   CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_RDI);
  std::__cxx11::string::~string(local_30);
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    this_00 = (VRMatrix4 *)&stack0xffffffffffffff27;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    m2 = VRDataIndex::getValue
                   (in_stack_00000168,in_stack_00000160,in_stack_00000158,in_stack_00000157);
    t.datum._6_1_ = bVar1;
    t.datum._0_6_ = in_stack_ffffffffffffff20;
    t.datum._7_1_ = in_stack_ffffffffffffff27;
    local_80 = m2.datum;
    VRMatrix4::VRMatrix4(in_RDI,t);
    VRMatrix4::operator=(this_00,(VRMatrix4 *)m2.datum);
    VRMatrix4::~VRMatrix4(&local_78);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  return;
}

Assistant:

void
VRHeadTrackingNode::onVREvent(const VRDataIndex &e)
{
	if (e.getName() == _trackingEvent) {
        _headMatrix = e.getValue("Transform");
    }
}